

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O1

bool bssl::tls13_export_keying_material
               (SSL *ssl,Span<unsigned_char> out,Span<const_unsigned_char> secret,string_view label,
               Span<const_unsigned_char> context)

{
  string_view label_00;
  Span<const_unsigned_char> hash;
  Span<const_unsigned_char> hash_00;
  Span<unsigned_char> out_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  SSL_SESSION *session;
  EVP_MD *type;
  undefined4 extraout_var;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_01;
  uint8_t derived_secret_buf [64];
  uint8_t hash_buf [64];
  uint8_t export_context_buf [64];
  uint local_148;
  uint local_144;
  size_t local_140;
  uchar *local_138;
  size_t local_130;
  uchar *local_128;
  size_t sStack_120;
  size_t local_118;
  char *pcStack_110;
  uchar *local_108;
  size_t sStack_100;
  uchar local_f8 [64];
  uchar local_b8 [64];
  uchar local_78 [72];
  
  local_130 = out.size_;
  local_138 = out.data_;
  if (secret.size_ != 0) {
    session = SSL_get_session((SSL *)ssl);
    type = (EVP_MD *)ssl_session_get_digest((SSL_SESSION *)session);
    bVar1 = false;
    iVar2 = EVP_Digest(context.data_,context.size_,local_b8,&local_144,type,(ENGINE *)0x0);
    if (iVar2 != 0) {
      bVar1 = false;
      iVar2 = EVP_Digest((void *)0x0,0,local_78,&local_148,type,(ENGINE *)0x0);
      if (iVar2 != 0) {
        local_140 = (size_t)local_144;
        iVar2 = EVP_MD_size(type);
        local_108 = local_78;
        sStack_100 = (ulong)local_148;
        iVar3 = SSL_is_dtls(ssl);
        hash.size_ = sStack_100;
        hash.data_ = local_108;
        out_01.size_ = CONCAT44(extraout_var,iVar2);
        out_01.data_ = local_f8;
        bVar1 = hkdf_expand_label(out_01,(EVP_MD *)type,secret,label,hash,iVar3 != 0);
        if (bVar1) {
          local_118 = 8;
          pcStack_110 = "exporter";
          local_128 = local_b8;
          sStack_120 = local_140;
          iVar3 = SSL_is_dtls(ssl);
          out_00.size_ = local_130;
          out_00.data_ = local_138;
          label_00._M_str = pcStack_110;
          label_00._M_len = local_118;
          hash_00.size_ = sStack_120;
          hash_00.data_ = local_128;
          secret_00.size_ = CONCAT44(extraout_var,iVar2);
          secret_00.data_ = local_f8;
          bVar1 = hkdf_expand_label(out_00,(EVP_MD *)type,secret_00,label_00,hash_00,iVar3 != 0);
        }
        else {
          bVar1 = false;
        }
      }
    }
    return bVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                ,0x1de,
                "bool bssl::tls13_export_keying_material(const SSL *, Span<uint8_t>, Span<const uint8_t>, std::string_view, Span<const uint8_t>)"
               );
}

Assistant:

bool tls13_export_keying_material(const SSL *ssl, Span<uint8_t> out,
                                  Span<const uint8_t> secret,
                                  std::string_view label,
                                  Span<const uint8_t> context) {
  if (secret.empty()) {
    assert(0);
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EVP_MD *digest = ssl_session_get_digest(SSL_get_session(ssl));

  uint8_t hash_buf[EVP_MAX_MD_SIZE];
  uint8_t export_context_buf[EVP_MAX_MD_SIZE];
  unsigned hash_len;
  unsigned export_context_len;
  if (!EVP_Digest(context.data(), context.size(), hash_buf, &hash_len, digest,
                  nullptr) ||
      !EVP_Digest(nullptr, 0, export_context_buf, &export_context_len, digest,
                  nullptr)) {
    return false;
  }

  auto hash = Span(hash_buf, hash_len);
  auto export_context = Span(export_context_buf, export_context_len);
  uint8_t derived_secret_buf[EVP_MAX_MD_SIZE];
  auto derived_secret = Span(derived_secret_buf, EVP_MD_size(digest));
  return hkdf_expand_label(derived_secret, digest, secret, label,
                           export_context, SSL_is_dtls(ssl)) &&
         hkdf_expand_label(out, digest, derived_secret, kTLS13LabelExportKeying,
                           hash, SSL_is_dtls(ssl));
}